

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_rsa_sig_verify
              (LIBSSH2_SESSION *session,uchar *sig,size_t sig_len,uchar *m,size_t m_len,
              void **abstract)

{
  EVP_PKEY *rsactx;
  void **abstract_local;
  size_t m_len_local;
  uchar *m_local;
  size_t sig_len_local;
  uchar *sig_local;
  LIBSSH2_SESSION *session_local;
  
  if (sig_len < 0xf) {
    session_local._4_4_ = -1;
  }
  else {
    session_local._4_4_ =
         _libssh2_rsa_sha1_verify((EVP_PKEY *)*abstract,sig + 0xf,sig_len - 0xf,m,m_len);
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_rsa_sig_verify(LIBSSH2_SESSION * session,
                                  const unsigned char *sig,
                                  size_t sig_len,
                                  const unsigned char *m,
                                  size_t m_len, void **abstract)
{
    libssh2_rsa_ctx *rsactx = (libssh2_rsa_ctx *) (*abstract);
    (void)session;

    /* Skip past keyname_len(4) + keyname(7){"ssh-rsa"} + signature_len(4) */
    if(sig_len < 15)
        return -1;

    sig += 15;
    sig_len -= 15;
    return _libssh2_rsa_sha1_verify(rsactx, sig, sig_len, m, m_len);
}